

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O1

siphash * sip24_update(siphash *H,void *src,size_t len)

{
  uchar **ppuVar1;
  uchar uVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  
  puVar6 = (uchar *)(len + (long)src);
  ppuVar1 = &H->p;
  do {
    bVar7 = src < puVar6;
    if (bVar7) {
      puVar3 = *ppuVar1;
      puVar5 = (uchar *)src;
      while (src = puVar5, puVar3 < ppuVar1) {
        src = puVar5 + 1;
        uVar2 = *puVar5;
        *ppuVar1 = puVar3 + 1;
        *puVar3 = uVar2;
        bVar7 = src < puVar6;
        if (!bVar7) break;
        puVar5 = (uchar *)src;
        puVar3 = *ppuVar1;
      }
    }
    if (*ppuVar1 < ppuVar1) {
      return H;
    }
    uVar4 = *(ulong *)H->buf;
    H->v3 = H->v3 ^ uVar4;
    sip_round(H,2);
    H->v0 = H->v0 ^ uVar4;
    H->p = H->buf;
    H->c = H->c + 8;
    if (!bVar7) {
      return H;
    }
  } while( true );
}

Assistant:

static struct siphash *
sip24_update(struct siphash *H, const void *src, size_t len) {
  const unsigned char *p = (const unsigned char *)src, *pe = p + len;
  uint64_t m;

  do {
    while (p < pe && H->p < sip_endof(H->buf))
      *H->p++ = *p++;

    if (H->p < sip_endof(H->buf))
      break;

    m = SIP_U8TO64_LE(H->buf);
    H->v3 ^= m;
    sip_round(H, 2);
    H->v0 ^= m;

    H->p = H->buf;
    H->c += 8;
  } while (p < pe);

  return H;
}